

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2Comment(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  int local_2c;
  int n_value;
  xmlChar *value;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (value._4_4_ = 0; (int)value._4_4_ < 2; value._4_4_ = value._4_4_ + 1) {
    for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_void_ptr(value._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_2c,1);
      xmlSAX2Comment(val,val_00);
      call_tests = call_tests + 1;
      des_void_ptr(value._4_4_,val,0);
      des_const_xmlChar_ptr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Comment",(ulong)(uint)(iVar2 - iVar1));
        ctx._4_4_ = ctx._4_4_ + 1;
        printf(" %d",(ulong)value._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2Comment(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    xmlChar * value; /* the xmlSAX2Comment content */
    int n_value;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        value = gen_const_xmlChar_ptr(n_value, 1);

        xmlSAX2Comment(ctx, (const xmlChar *)value);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_value, (const xmlChar *)value, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2Comment",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_value);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}